

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

Llb_Mtr_t * Llb_MtrCreate(Llb_Man_t *p)

{
  Llb_Mtr_t *p_00;
  Llb_Grp_t *pGrp;
  int i;
  
  p_00 = Llb_MtrAlloc(p->pAig->nTruePis,p->pAig->nRegs,p->vGroups->nSize,p->vVar2Obj->nSize);
  for (i = 0; i < p->vGroups->nSize; i = i + 1) {
    pGrp = (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,i);
    Llb_MtrAddColumn(p_00,pGrp);
  }
  return p_00;
}

Assistant:

Llb_Mtr_t * Llb_MtrCreate( Llb_Man_t * p )
{
    Llb_Mtr_t * pMatrix;
    Llb_Grp_t * pGroup;
    int i;
    pMatrix = Llb_MtrAlloc( Saig_ManPiNum(p->pAig), Saig_ManRegNum(p->pAig), 
        Vec_PtrSize(p->vGroups), Vec_IntSize(p->vVar2Obj) );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGroup, i )
        Llb_MtrAddColumn( pMatrix, pGroup );
//    Llb_MtrRemoveSingletonRows( pMatrix );
    return pMatrix;
}